

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

void __thiscall Glucose::SimpSolver::SimpSolver(SimpSolver *this,SimpSolver *s)

{
  ClauseAllocator *this_00;
  int iVar1;
  Ref RVar2;
  vec<Glucose::Lit> local_68;
  vec<char> *local_58;
  vec<char> *local_50;
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *local_48;
  vec<char> *local_40;
  vec<unsigned_int> *local_38;
  
  Solver::Solver(&this->super_Solver,&s->super_Solver);
  (this->super_Solver).super_Clone._vptr_Clone = (_func_int **)&PTR_clone_00123be0;
  iVar1 = s->clause_lim;
  this->grow = s->grow;
  this->clause_lim = iVar1;
  this->subsumption_lim = s->subsumption_lim;
  this->simp_garbage_frac = s->simp_garbage_frac;
  this->use_asymm = s->use_asymm;
  this->use_rcheck = s->use_rcheck;
  this->use_elim = s->use_elim;
  iVar1 = s->asymm_lits;
  this->merges = s->merges;
  this->asymm_lits = iVar1;
  this->eliminated_vars = s->eliminated_vars;
  this->use_simplification = s->use_simplification;
  this->elimorder = s->elimorder;
  local_38 = &this->elimclauses;
  local_40 = &this->touched;
  local_48 = &this->occurs;
  this_00 = &(this->super_Solver).ca;
  (this->elimclauses).data = (uint *)0x0;
  (this->elimclauses).sz = 0;
  (this->elimclauses).cap = 0;
  (this->touched).data = (char *)0x0;
  (this->touched).sz = 0;
  (this->touched).cap = 0;
  (this->occurs).occs.data = (vec<unsigned_int> *)0x0;
  (this->occurs).occs.sz = 0;
  (this->occurs).occs.cap = 0;
  (this->occurs).dirty.data = (char *)0x0;
  (this->occurs).dirty.sz = 0;
  (this->occurs).dirty.cap = 0;
  (this->occurs).dirties.data = (int *)0x0;
  (this->occurs).dirties.sz = 0;
  (this->occurs).dirties.cap = 0;
  (this->occurs).deleted.ca = this_00;
  (this->n_occ).data = (int *)0x0;
  (this->n_occ).sz = 0;
  (this->n_occ).cap = 0;
  (this->elim_heap).lt.n_occ = &this->n_occ;
  (this->elim_heap).heap.data = (int *)0x0;
  (this->elim_heap).heap.sz = 0;
  (this->elim_heap).heap.cap = 0;
  (this->elim_heap).indices.data = (int *)0x0;
  (this->elim_heap).indices.sz = 0;
  (this->elim_heap).indices.cap = 0;
  (this->subsumption_queue).buf.data = (uint *)0x0;
  (this->subsumption_queue).buf.sz = 0;
  (this->subsumption_queue).buf.cap = 0;
  vec<unsigned_int>::growTo(&(this->subsumption_queue).buf,1);
  local_50 = &this->frozen;
  local_58 = &this->eliminated;
  (this->frozen).sz = 0;
  (this->frozen).cap = 0;
  (this->eliminated).data = (char *)0x0;
  (this->subsumption_queue).first = 0;
  (this->subsumption_queue).end = 0;
  (this->frozen).data = (char *)0x0;
  (this->eliminated).sz = 0;
  (this->eliminated).cap = 0;
  iVar1 = s->n_touched;
  this->bwdsub_assigns = s->bwdsub_assigns;
  this->n_touched = iVar1;
  local_68.data = (Lit *)0x0;
  local_68.sz = 0;
  local_68.cap = 0;
  vec<Glucose::Lit>::growTo(&local_68,1,(Lit *)&lit_Undef);
  (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.field_0x14 = 1;
  RVar2 = RegionAllocator<unsigned_int>::alloc
                    (&this_00->super_RegionAllocator<unsigned_int>,local_68.sz + 4);
  Clause::Clause<Glucose::vec<Glucose::Lit>>
            ((Clause *)((this_00->super_RegionAllocator<unsigned_int>).memory + RVar2),&local_68,1,
             false);
  this->bwdsub_tmpunit = RVar2;
  (this->super_Solver).remove_satisfied = false;
  vec<unsigned_int>::capacity(local_38,(s->elimclauses).cap);
  (this->elimclauses).sz = (s->elimclauses).sz;
  memcpy((this->elimclauses).data,(s->elimclauses).data,(long)(s->elimclauses).cap << 2);
  vec<char>::capacity(local_40,(s->touched).cap);
  (this->touched).sz = (s->touched).sz;
  memcpy((this->touched).data,(s->touched).data,(long)(s->touched).cap);
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::copyTo
            (&s->occurs,local_48);
  vec<int>::capacity(&this->n_occ,(s->n_occ).cap);
  (this->n_occ).sz = (s->n_occ).sz;
  memcpy((this->n_occ).data,(s->n_occ).data,(long)(s->n_occ).cap << 2);
  vec<int>::copyTo(&(s->elim_heap).heap,&(this->elim_heap).heap);
  vec<int>::copyTo(&(s->elim_heap).indices,&(this->elim_heap).indices);
  iVar1 = (s->subsumption_queue).end;
  (this->subsumption_queue).first = (s->subsumption_queue).first;
  (this->subsumption_queue).end = iVar1;
  vec<unsigned_int>::capacity(&(this->subsumption_queue).buf,(s->subsumption_queue).buf.cap);
  (this->subsumption_queue).buf.sz = (s->subsumption_queue).buf.sz;
  memcpy((this->subsumption_queue).buf.data,(s->subsumption_queue).buf.data,
         (long)(s->subsumption_queue).buf.cap << 2);
  vec<char>::capacity(local_50,(s->frozen).cap);
  (this->frozen).sz = (s->frozen).sz;
  memcpy((this->frozen).data,(s->frozen).data,(long)(s->frozen).cap);
  vec<char>::capacity(local_58,(s->eliminated).cap);
  (this->eliminated).sz = (s->eliminated).sz;
  memcpy((this->eliminated).data,(s->eliminated).data,(long)(s->eliminated).cap);
  this->use_simplification = s->use_simplification;
  iVar1 = s->n_touched;
  this->bwdsub_assigns = s->bwdsub_assigns;
  this->n_touched = iVar1;
  this->bwdsub_tmpunit = s->bwdsub_tmpunit;
  (this->super_Solver).qhead = (s->super_Solver).qhead;
  (this->super_Solver).ok = (s->super_Solver).ok;
  if (local_68.data != (Lit *)0x0) {
    local_68._8_8_ = local_68._8_8_ & 0xffffffff00000000;
    free(local_68.data);
  }
  return;
}

Assistant:

SimpSolver::SimpSolver(const SimpSolver &s) : Solver(s)
  , grow               (s.grow)
  , clause_lim         (s.clause_lim)
  , subsumption_lim    (s.subsumption_lim)
  , simp_garbage_frac  (s.simp_garbage_frac)
  , use_asymm          (s.use_asymm)
  , use_rcheck         (s.use_rcheck)
  , use_elim           (s.use_elim)
  , merges             (s.merges)
  , asymm_lits         (s.asymm_lits)
  , eliminated_vars    (s.eliminated_vars)
  , use_simplification (s.use_simplification)
  , elimorder          (s.elimorder)
  , occurs             (ClauseDeleted(ca))
  , elim_heap          (ElimLt(n_occ))
  , bwdsub_assigns     (s.bwdsub_assigns)
  , n_touched          (s.n_touched)
{
    // TODO: Copy dummy... what is it???
    vec<Lit> dummy(1,lit_Undef);
    ca.extra_clause_field = true; // NOTE: must happen before allocating the dummy clause below.
    bwdsub_tmpunit        = ca.alloc(dummy);
    remove_satisfied      = false;
    //End TODO  
    

    s.elimclauses.memCopyTo(elimclauses);
    s.touched.memCopyTo(touched);
    s.occurs.copyTo(occurs);
    s.n_occ.memCopyTo(n_occ);
    s.elim_heap.copyTo(elim_heap);
    s.subsumption_queue.copyTo(subsumption_queue);
    s.frozen.memCopyTo(frozen);
    s.eliminated.memCopyTo(eliminated);

    use_simplification = s.use_simplification;
    bwdsub_assigns = s.bwdsub_assigns;
    n_touched = s.n_touched;
    bwdsub_tmpunit = s.bwdsub_tmpunit;
    qhead = s.qhead;
    ok = s.ok;
}